

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall CoreML::Model::Model(Model *this)

{
  element_type *this_00;
  shared_ptr<CoreML::Specification::Model> local_20;
  Model *local_10;
  Model *this_local;
  
  this->_vptr_Model = (_func_int **)&PTR__Model_00576140;
  local_10 = this;
  std::shared_ptr<CoreML::Specification::Model>::shared_ptr(&this->m_spec);
  std::make_shared<CoreML::Specification::Model>();
  std::shared_ptr<CoreML::Specification::Model>::operator=(&this->m_spec,&local_20);
  std::shared_ptr<CoreML::Specification::Model>::~shared_ptr(&local_20);
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_spec);
  Specification::Model::set_specificationversion(this_00,5);
  return;
}

Assistant:

Model::Model() {
        m_spec = std::make_shared<Specification::Model>();
        m_spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    }